

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warn.cc
# Opt level: O0

void __thiscall re2c::Warn::set(Warn *this,type_t t,option_t o)

{
  option_t o_local;
  type_t t_local;
  Warn *this_local;
  
  switch(o) {
  case W:
    this->mask[t] = this->mask[t] | 1;
    break;
  case WNO:
    this->mask[t] = this->mask[t] & 0xfffffffe;
    break;
  case WERROR:
    this->mask[t] = this->mask[t] | 3;
    break;
  case WNOERROR:
    this->mask[t] = this->mask[t] & 0xfffffffd;
  }
  return;
}

Assistant:

void Warn::set (type_t t, option_t o)
{
	switch (o)
	{
		case W:
			mask[t] |= WARNING;
			break;
		case WNO:
			mask[t] &= ~WARNING;
			break;
		case WERROR:
			// unlike -Werror, -Werror-<warning> implies -W<warning>
			mask[t] |= (WARNING | ERROR);
			break;
		case WNOERROR:
			mask[t] &= ~ERROR;
			break;
	}
}